

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_test.c
# Opt level: O0

u16 exps16Mul(u16 a,u16 b,u16 poly)

{
  ushort uVar1;
  u16 c;
  size_t i;
  u16 poly_local;
  u16 b_local;
  u16 a_local;
  
  c = 0;
  b_local = b;
  a_local = a;
  for (i = 0; i < 0x10; i = i + 1) {
    uVar1 = b_local;
    if ((a_local & 1) == 0) {
      uVar1 = 0;
    }
    c = c ^ uVar1;
    a_local = (u16)((int)(uint)a_local >> 1);
    uVar1 = poly;
    if ((b_local & 0x8000) == 0) {
      uVar1 = 0;
    }
    b_local = b_local << 1 ^ uVar1;
  }
  return c;
}

Assistant:

static u16 exps16Mul(u16 a, u16 b, u16 poly)
{
	size_t i;
	u16 c;
	for (c = 0, i = 0; i < 16; ++i)
	{
		c ^= (a & 1) ? b : 0;
		a >>= 1;
		b = (b << 1) ^ ((b & 0x8000) ? poly : 0);
	}
	return c;
}